

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b-ref.c
# Opt level: O1

int blake2b_init(blake2b_state *S,uint8_t outlen)

{
  ulong *puVar1;
  uint64_t uVar2;
  int iVar3;
  long lVar4;
  uint8_t local_58 [64];
  
  iVar3 = -1;
  if (0xbf < (byte)(outlen + 0xbf)) {
    local_58[1] = '\0';
    local_58[2] = '\x01';
    local_58[3] = 1;
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_58[8] = '\0';
    local_58[9] = '\0';
    local_58[10] = '\0';
    local_58[0xb] = '\0';
    local_58[0xc] = '\0';
    local_58[0xd] = '\0';
    local_58[0xe] = '\0';
    local_58[0xf] = '\0';
    local_58[0x10] = '\0';
    local_58[0x11] = '\0';
    local_58[0x12] = '\0';
    local_58[0x13] = '\0';
    local_58[0x14] = '\0';
    local_58[0x15] = '\0';
    local_58[0x16] = '\0';
    local_58[0x17] = '\0';
    local_58[0x18] = '\0';
    local_58[0x19] = '\0';
    local_58[0x1a] = '\0';
    local_58[0x1b] = '\0';
    local_58[0x1c] = '\0';
    local_58[0x1d] = '\0';
    local_58[0x1e] = '\0';
    local_58[0x1f] = '\0';
    local_58[0x20] = '\0';
    local_58[0x21] = '\0';
    local_58[0x22] = '\0';
    local_58[0x23] = '\0';
    local_58[0x24] = '\0';
    local_58[0x25] = '\0';
    local_58[0x26] = '\0';
    local_58[0x27] = '\0';
    local_58[0x28] = '\0';
    local_58[0x29] = '\0';
    local_58[0x2a] = '\0';
    local_58[0x2b] = '\0';
    local_58[0x2c] = '\0';
    local_58[0x2d] = '\0';
    local_58[0x2e] = '\0';
    local_58[0x2f] = '\0';
    local_58[0x30] = '\0';
    local_58[0x31] = '\0';
    local_58[0x32] = '\0';
    local_58[0x33] = '\0';
    local_58[0x34] = '\0';
    local_58[0x35] = '\0';
    local_58[0x36] = '\0';
    local_58[0x37] = '\0';
    local_58[0x38] = '\0';
    local_58[0x39] = '\0';
    local_58[0x3a] = '\0';
    local_58[0x3b] = '\0';
    local_58[0x3c] = '\0';
    local_58[0x3d] = '\0';
    local_58[0x3e] = '\0';
    local_58[0x3f] = '\0';
    iVar3 = 0;
    local_58[0] = outlen;
    memset(S->t,0,0x140);
    S->h[0] = 0x6a09e667f3bcc908;
    S->h[1] = 0xbb67ae8584caa73b;
    S->h[2] = 0x3c6ef372fe94f82b;
    S->h[3] = 0xa54ff53a5f1d36f1;
    S->h[4] = 0x510e527fade682d1;
    S->h[5] = 0x9b05688c2b3e6c1f;
    S->h[6] = 0x1f83d9abfb41bd6b;
    S->h[7] = 0x5be0cd19137e2179;
    lVar4 = 0;
    do {
      uVar2 = load64(local_58 + lVar4);
      puVar1 = (ulong *)((long)S->h + lVar4);
      *puVar1 = *puVar1 ^ uVar2;
      lVar4 = lVar4 + 8;
    } while (lVar4 != 0x40);
  }
  return iVar3;
}

Assistant:

int blake2b_init( blake2b_state *S, const uint8_t outlen )
{
  blake2b_param P[1];

  if ( ( !outlen ) || ( outlen > BLAKE2B_OUTBYTES ) ) return -1;

  P->digest_length = outlen;
  P->key_length    = 0;
  P->fanout        = 1;
  P->depth         = 1;
  store32( &P->leaf_length, 0 );
  store64( &P->node_offset, 0 );
  P->node_depth    = 0;
  P->inner_length  = 0;
  memset( P->reserved, 0, sizeof( P->reserved ) );
  memset( P->salt,     0, sizeof( P->salt ) );
  memset( P->personal, 0, sizeof( P->personal ) );
  return blake2b_init_param( S, P );
}